

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fees.cpp
# Opt level: O3

double __thiscall
TxConfirmStats::EstimateMedianVal
          (TxConfirmStats *this,int confTarget,double sufficientTxVal,double successBreakPoint,
          uint nBlockHeight,EstimationResult *result)

{
  double dVar1;
  pointer pdVar2;
  pointer pvVar3;
  pointer pvVar4;
  pointer pvVar5;
  pointer piVar6;
  long lVar7;
  bool bVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  bool bVar13;
  bool bVar14;
  uint uVar15;
  long lVar16;
  double *pdVar17;
  Logger *this_00;
  uint uVar18;
  double *pdVar19;
  byte bVar20;
  int iVar21;
  double *pdVar22;
  uint uVar23;
  double *pdVar24;
  uint uVar25;
  uint uVar26;
  ulong uVar27;
  pointer pdVar28;
  uint uVar29;
  int iVar30;
  long in_FS_OFFSET;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  string_view source_file;
  string_view logging_function;
  uint local_108;
  double local_c0;
  float failed_within_target_perc;
  float passed_within_target_perc;
  double median;
  double local_a8;
  double dStack_a0;
  undefined1 local_98 [8];
  double dStack_90;
  double local_88;
  double dStack_80;
  double local_78;
  double dStack_70;
  double local_68;
  double dStack_60;
  double local_58;
  double adStack_50 [2];
  int confTarget_local;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar25 = this->scale;
  pdVar2 = (this->buckets->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pvVar3 = (this->unconfTxs).
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pvVar4 = (this->unconfTxs).
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar18 = (int)((ulong)((long)(this->buckets->super__Vector_base<double,_std::allocator<double>_>).
                               _M_impl.super__Vector_impl_data._M_finish - (long)pdVar2) >> 3) - 1;
  local_78 = -1.0;
  dStack_70 = -1.0;
  dVar9 = 0.0;
  dVar12 = 0.0;
  local_68 = 0.0;
  dStack_60 = 0.0;
  local_58 = 0.0;
  adStack_50[0] = 0.0;
  local_a8 = -1.0;
  dStack_a0 = -1.0;
  _local_98 = ZEXT816(0);
  local_88 = 0.0;
  dStack_80 = 0.0;
  uVar29 = uVar18;
  local_108 = uVar18;
  if ((int)uVar18 < 0) {
    pdVar28 = (this->txCtAvg).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    bVar14 = true;
    dVar38 = 0.0;
    bVar20 = 0;
    dVar32 = 0.0;
    dVar33 = 0.0;
    dVar31 = 0.0;
    dVar34 = 0.0;
    dVar1 = 0.0;
    uVar25 = uVar18;
  }
  else {
    lVar16 = (long)(int)(((confTarget + uVar25) - 1) / uVar25);
    pdVar28 = (this->txCtAvg).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    pvVar5 = (this->confAvg).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar25 = (int)((ulong)((long)(this->confAvg).
                                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar5) >> 3) *
             uVar25 * -0x55555555;
    piVar6 = (this->oldUnconfTxs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    dVar1 = this->decay;
    lVar7 = *(long *)&pvVar5[lVar16 + -1].super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl;
    lVar16 = *(long *)&(this->failAvg).
                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[lVar16 + -1].
                       super__Vector_base<double,_std::allocator<double>_>._M_impl;
    dVar38 = 0.0;
    dVar32 = 0.0;
    dVar33 = 0.0;
    dVar31 = 0.0;
    dVar34 = 0.0;
    dVar36 = 0.0;
    dVar9 = 0.0;
    dVar12 = 0.0;
    bVar14 = true;
    iVar30 = 0;
    bVar20 = 0;
    bVar13 = true;
    uVar27 = (ulong)uVar18;
    do {
      uVar26 = (uint)uVar27;
      if (bVar14) {
        bVar14 = false;
        uVar29 = uVar26;
      }
      dVar35 = dVar34 + *(double *)(lVar16 + uVar27 * 8);
      uVar23 = nBlockHeight - confTarget;
      iVar21 = uVar25 - confTarget;
      if ((uint)confTarget < uVar25) {
        do {
          iVar30 = iVar30 + *(int *)(*(long *)&pvVar4[(ulong)uVar23 %
                                                      (ulong)(uint)((int)((ulong)((long)pvVar3 -
                                                                                 (long)pvVar4) >> 3)
                                                                   * -0x55555555)].
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                               .super__Vector_impl_data + uVar27 * 4);
          uVar23 = uVar23 - 1;
          iVar21 = iVar21 + -1;
        } while (iVar21 != 0);
      }
      dVar36 = dVar36 + pdVar28[uVar27];
      dVar10 = dVar9 + *(double *)(lVar7 + uVar27 * 8);
      dVar11 = dVar12 + pdVar28[uVar27];
      iVar30 = iVar30 + piVar6[uVar27];
      dVar34 = dVar35;
      dVar9 = dVar10;
      dVar12 = dVar11;
      if (sufficientTxVal / (1.0 - dVar1) <= dVar36) {
        dVar37 = (double)iVar30;
        if (successBreakPoint <= dVar10 / (dVar11 + dVar35 + dVar37)) {
          local_88 = 0.0;
          dStack_80 = 0.0;
          _local_98 = ZEXT816(0);
          local_a8 = -1.0;
          dVar9 = 0.0;
          dVar12 = 0.0;
          iVar30 = 0;
          dVar34 = 0.0;
          bVar13 = true;
          dStack_a0 = -1.0;
          pdVar17 = &local_68;
          pdVar19 = &dStack_60;
          pdVar24 = &local_58;
          pdVar22 = adStack_50;
          bVar14 = true;
          bVar20 = 1;
          dVar31 = dVar11;
          dVar32 = dVar35;
          dVar33 = dVar37;
          dVar38 = dVar10;
          local_108 = uVar29;
        }
        else {
          dVar36 = 0.0;
          if (!bVar13) goto LAB_0097331d;
          uVar15 = uVar26;
          uVar23 = uVar29;
          if (uVar26 < uVar29) {
            uVar15 = uVar29;
            uVar23 = uVar26;
          }
          if (uVar23 != 0) {
            dVar36 = pdVar2[uVar23 - 1];
          }
          dStack_a0 = pdVar2[uVar15];
          bVar13 = false;
          pdVar17 = (double *)local_98;
          pdVar19 = (double *)(local_98 + 8);
          pdVar24 = &local_88;
          pdVar22 = &dStack_80;
          uVar26 = uVar18;
          local_a8 = dVar36;
        }
        *pdVar17 = dVar10;
        *pdVar19 = dVar11;
        *pdVar24 = dVar37;
        *pdVar22 = dVar35;
        dVar36 = 0.0;
        uVar18 = uVar26;
      }
LAB_0097331d:
      bVar8 = 0 < (long)uVar27;
      uVar27 = uVar27 - 1;
    } while (bVar8);
    dVar1 = (double)iVar30;
    dVar38 = dVar38 * 100.0;
    bVar14 = (bool)(bVar13 ^ 1U | bVar14);
    uVar25 = 0;
  }
  median = -1.0;
  uVar26 = uVar18;
  if (uVar18 < local_108) {
    uVar26 = local_108;
    local_108 = uVar18;
  }
  dVar36 = 0.0;
  uVar18 = local_108;
  do {
    dVar36 = dVar36 + pdVar28[uVar18];
    uVar18 = uVar18 + 1;
  } while (uVar18 <= uVar26);
  if ((bool)(bVar20 & dVar36 != 0.0)) {
    dVar36 = dVar36 * 0.5;
    uVar18 = local_108;
    do {
      dVar35 = pdVar28[uVar18];
      if (dVar36 <= dVar35) {
        median = (this->m_feerate_avg).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar18] / dVar35;
        break;
      }
      dVar36 = dVar36 - dVar35;
      uVar18 = uVar18 + 1;
    } while (uVar18 <= uVar26);
    if (local_108 == 0) {
      local_78 = 0.0;
    }
    else {
      local_78 = pdVar2[local_108 - 1];
    }
    dStack_70 = pdVar2[uVar26];
  }
  if (!bVar14) {
    uVar18 = uVar25;
    if (uVar25 < uVar29) {
      uVar18 = uVar29;
      uVar29 = uVar25;
    }
    if (uVar29 == 0) {
      local_a8 = 0.0;
    }
    else {
      local_a8 = pdVar2[uVar29 - 1];
    }
    dStack_a0 = pdVar2[uVar18];
    unique0x100004b7 = SUB84(dVar12,0);
    local_98 = (undefined1  [8])dVar9;
    unique0x100004bb = (int)((ulong)dVar12 >> 0x20);
    local_88 = dVar1;
    dStack_80 = dVar34;
  }
  passed_within_target_perc = 0.0;
  failed_within_target_perc = 0.0;
  dVar32 = dVar31 + dVar33 + dVar32;
  if ((dVar32 != 0.0) || (NAN(dVar32))) {
    passed_within_target_perc = (float)(dVar38 / dVar32);
  }
  dVar9 = dStack_90 + local_88 + dStack_80;
  if ((dVar9 != 0.0) || (NAN(dVar9))) {
    failed_within_target_perc = (float)(((double)local_98 * 100.0) / dVar9);
  }
  confTarget_local = confTarget;
  this_00 = LogInstance();
  bVar14 = BCLog::Logger::WillLogCategoryLevel(this_00,ESTIMATEFEE,Debug);
  if (bVar14) {
    local_c0 = successBreakPoint * 100.0;
    source_file._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/policy/fees.cpp"
    ;
    source_file._M_len = 0x5f;
    logging_function._M_str = "EstimateMedianVal";
    logging_function._M_len = 0x11;
    LogPrintFormatInternal<int,double,double,double,double,double,float,double,double,double,double,double,double,float,double,double,double,double>
              (logging_function,source_file,0x18b,ESTIMATEFEE,Debug,
               (ConstevalFormatString<18U>)0xf975d3,&confTarget_local,&local_c0,&this->decay,&median
               ,&local_78,&dStack_70,&passed_within_target_perc,&local_68,&dStack_60,&local_58,
               adStack_50,&local_a8,&dStack_a0,&failed_within_target_perc,(double *)local_98,
               (double *)(local_98 + 8),&local_88,&dStack_80);
  }
  if (result != (EstimationResult *)0x0) {
    (result->pass).inMempool = local_58;
    (result->pass).leftMempool = adStack_50[0];
    (result->pass).withinTarget = local_68;
    (result->pass).totalConfirmed = dStack_60;
    (result->pass).start = local_78;
    (result->pass).end = dStack_70;
    (result->fail).start = local_a8;
    (result->fail).end = dStack_a0;
    (result->fail).withinTarget = (double)local_98;
    (result->fail).totalConfirmed = dStack_90;
    (result->fail).inMempool = local_88;
    (result->fail).leftMempool = dStack_80;
    result->decay = this->decay;
    result->scale = this->scale;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return median;
}

Assistant:

double TxConfirmStats::EstimateMedianVal(int confTarget, double sufficientTxVal,
                                         double successBreakPoint, unsigned int nBlockHeight,
                                         EstimationResult *result) const
{
    // Counters for a bucket (or range of buckets)
    double nConf = 0; // Number of tx's confirmed within the confTarget
    double totalNum = 0; // Total number of tx's that were ever confirmed
    int extraNum = 0;  // Number of tx's still in mempool for confTarget or longer
    double failNum = 0; // Number of tx's that were never confirmed but removed from the mempool after confTarget
    const int periodTarget = (confTarget + scale - 1) / scale;
    const int maxbucketindex = buckets.size() - 1;

    // We'll combine buckets until we have enough samples.
    // The near and far variables will define the range we've combined
    // The best variables are the last range we saw which still had a high
    // enough confirmation rate to count as success.
    // The cur variables are the current range we're counting.
    unsigned int curNearBucket = maxbucketindex;
    unsigned int bestNearBucket = maxbucketindex;
    unsigned int curFarBucket = maxbucketindex;
    unsigned int bestFarBucket = maxbucketindex;

    // We'll always group buckets into sets that meet sufficientTxVal --
    // this ensures that we're using consistent groups between different
    // confirmation targets.
    double partialNum = 0;

    bool foundAnswer = false;
    unsigned int bins = unconfTxs.size();
    bool newBucketRange = true;
    bool passing = true;
    EstimatorBucket passBucket;
    EstimatorBucket failBucket;

    // Start counting from highest feerate transactions
    for (int bucket = maxbucketindex; bucket >= 0; --bucket) {
        if (newBucketRange) {
            curNearBucket = bucket;
            newBucketRange = false;
        }
        curFarBucket = bucket;
        nConf += confAvg[periodTarget - 1][bucket];
        partialNum += txCtAvg[bucket];
        totalNum += txCtAvg[bucket];
        failNum += failAvg[periodTarget - 1][bucket];
        for (unsigned int confct = confTarget; confct < GetMaxConfirms(); confct++)
            extraNum += unconfTxs[(nBlockHeight - confct) % bins][bucket];
        extraNum += oldUnconfTxs[bucket];
        // If we have enough transaction data points in this range of buckets,
        // we can test for success
        // (Only count the confirmed data points, so that each confirmation count
        // will be looking at the same amount of data and same bucket breaks)

        if (partialNum < sufficientTxVal / (1 - decay)) {
            // the buckets we've added in this round aren't sufficient
            // so keep adding
            continue;
        } else {
            partialNum = 0; // reset for the next range we'll add

            double curPct = nConf / (totalNum + failNum + extraNum);

            // Check to see if we are no longer getting confirmed at the success rate
            if (curPct < successBreakPoint) {
                if (passing == true) {
                    // First time we hit a failure record the failed bucket
                    unsigned int failMinBucket = std::min(curNearBucket, curFarBucket);
                    unsigned int failMaxBucket = std::max(curNearBucket, curFarBucket);
                    failBucket.start = failMinBucket ? buckets[failMinBucket - 1] : 0;
                    failBucket.end = buckets[failMaxBucket];
                    failBucket.withinTarget = nConf;
                    failBucket.totalConfirmed = totalNum;
                    failBucket.inMempool = extraNum;
                    failBucket.leftMempool = failNum;
                    passing = false;
                }
                continue;
            }
            // Otherwise update the cumulative stats, and the bucket variables
            // and reset the counters
            else {
                failBucket = EstimatorBucket(); // Reset any failed bucket, currently passing
                foundAnswer = true;
                passing = true;
                passBucket.withinTarget = nConf;
                nConf = 0;
                passBucket.totalConfirmed = totalNum;
                totalNum = 0;
                passBucket.inMempool = extraNum;
                passBucket.leftMempool = failNum;
                failNum = 0;
                extraNum = 0;
                bestNearBucket = curNearBucket;
                bestFarBucket = curFarBucket;
                newBucketRange = true;
            }
        }
    }

    double median = -1;
    double txSum = 0;

    // Calculate the "average" feerate of the best bucket range that met success conditions
    // Find the bucket with the median transaction and then report the average feerate from that bucket
    // This is a compromise between finding the median which we can't since we don't save all tx's
    // and reporting the average which is less accurate
    unsigned int minBucket = std::min(bestNearBucket, bestFarBucket);
    unsigned int maxBucket = std::max(bestNearBucket, bestFarBucket);
    for (unsigned int j = minBucket; j <= maxBucket; j++) {
        txSum += txCtAvg[j];
    }
    if (foundAnswer && txSum != 0) {
        txSum = txSum / 2;
        for (unsigned int j = minBucket; j <= maxBucket; j++) {
            if (txCtAvg[j] < txSum)
                txSum -= txCtAvg[j];
            else { // we're in the right bucket
                median = m_feerate_avg[j] / txCtAvg[j];
                break;
            }
        }

        passBucket.start = minBucket ? buckets[minBucket-1] : 0;
        passBucket.end = buckets[maxBucket];
    }

    // If we were passing until we reached last few buckets with insufficient data, then report those as failed
    if (passing && !newBucketRange) {
        unsigned int failMinBucket = std::min(curNearBucket, curFarBucket);
        unsigned int failMaxBucket = std::max(curNearBucket, curFarBucket);
        failBucket.start = failMinBucket ? buckets[failMinBucket - 1] : 0;
        failBucket.end = buckets[failMaxBucket];
        failBucket.withinTarget = nConf;
        failBucket.totalConfirmed = totalNum;
        failBucket.inMempool = extraNum;
        failBucket.leftMempool = failNum;
    }

    float passed_within_target_perc = 0.0;
    float failed_within_target_perc = 0.0;
    if ((passBucket.totalConfirmed + passBucket.inMempool + passBucket.leftMempool)) {
        passed_within_target_perc = 100 * passBucket.withinTarget / (passBucket.totalConfirmed + passBucket.inMempool + passBucket.leftMempool);
    }
    if ((failBucket.totalConfirmed + failBucket.inMempool + failBucket.leftMempool)) {
        failed_within_target_perc = 100 * failBucket.withinTarget / (failBucket.totalConfirmed + failBucket.inMempool + failBucket.leftMempool);
    }

    LogDebug(BCLog::ESTIMATEFEE, "FeeEst: %d > %.0f%% decay %.5f: feerate: %g from (%g - %g) %.2f%% %.1f/(%.1f %d mem %.1f out) Fail: (%g - %g) %.2f%% %.1f/(%.1f %d mem %.1f out)\n",
             confTarget, 100.0 * successBreakPoint, decay,
             median, passBucket.start, passBucket.end,
             passed_within_target_perc,
             passBucket.withinTarget, passBucket.totalConfirmed, passBucket.inMempool, passBucket.leftMempool,
             failBucket.start, failBucket.end,
             failed_within_target_perc,
             failBucket.withinTarget, failBucket.totalConfirmed, failBucket.inMempool, failBucket.leftMempool);


    if (result) {
        result->pass = passBucket;
        result->fail = failBucket;
        result->decay = decay;
        result->scale = scale;
    }
    return median;
}